

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,BeliefSet *Beliefs,
          ValueFunctionPOMDPDiscrete *V)

{
  pointer pAVar1;
  pointer pAVar2;
  JointBeliefInterface *pJVar3;
  pointer pdVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  allocator_type local_41;
  ulong local_40;
  value_type_conflict3 local_38;
  
  pAVar1 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar2 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = -1.79769313486232e+308;
  uVar5 = (ulong)((long)(Beliefs->
                        super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(Beliefs->
                       super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 3;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)(int)uVar5,&local_38,&local_41);
  local_40 = uVar5 & 0xffffffff;
  for (uVar5 = 0; uVar5 != local_40; uVar5 = uVar5 + 1) {
    for (lVar6 = 0; (((long)pAVar1 - (long)pAVar2) / 0x28 & 0xffffffffU) * 0x28 - lVar6 != 0;
        lVar6 = lVar6 + 0x28) {
      pJVar3 = (Beliefs->
               super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar5];
      dVar7 = (double)(**(code **)(*(long *)((long)&pJVar3->field_0x0 +
                                            *(long *)((long)*pJVar3 + -0xb8)) + 0x80))
                                ((long)&pJVar3->field_0x0 + *(long *)((long)*pJVar3 + -0xb8),
                                 (long)&(((V->
                                          super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->_m_values).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl
                                 + lVar6);
      pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      if (pdVar4[uVar5] < dVar7) {
        pdVar4[uVar5] = dVar7;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSet &Beliefs,
                                      const ValueFunctionPOMDPDiscrete &V)
{
    int nrInV=V.size();
    int nrB=Beliefs.size();

    vector<double> values(nrB,-DBL_MAX);
    double x;

    for(int b=0;b!=nrB;b++)
        for(int i=0;i!=nrInV;i++)
        {
            // compute inner product of belief with vector
            x=Beliefs[b]->InnerProduct(V[i].GetValues());

            // keep the maximizing value
            if(x>values[b])
                values[b]=x;
        }
    
    return(values);
}